

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

void Gia_ObjSetXorLevel(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int b;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsXor(pObj);
  if (iVar1 != 0) {
    pGVar2 = Gia_ObjFanin0(pObj);
    iVar1 = Gia_ObjLevel(p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    b = Gia_ObjLevel(p,pGVar2);
    iVar1 = Abc_MaxInt(iVar1,b);
    Gia_ObjSetLevel(p,pObj,iVar1 + 2);
    return;
  }
  __assert_fail("Gia_ObjIsXor(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x243,"void Gia_ObjSetXorLevel(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void         Gia_ObjSetXorLevel( Gia_Man_t * p, Gia_Obj_t * pObj ) { assert( Gia_ObjIsXor(pObj) ); Gia_ObjSetLevel( p, pObj, 2+Abc_MaxInt(Gia_ObjLevel(p,Gia_ObjFanin0(pObj)),Gia_ObjLevel(p,Gia_ObjFanin1(pObj))) ); }